

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::IVertexData::AddVertexMapping(IVertexData *this,uint32_t oldIndex,uint32_t newIndex)

{
  mapped_type *dest;
  mapped_type *this_00;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_30 = newIndex;
  local_2c = oldIndex;
  dest = std::
         map<unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>_>
         ::operator[](&this->boneAssignmentsMap,&local_30);
  BoneAssignmentsForVertex(this,oldIndex,newIndex,dest);
  this_00 = std::
            map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->vertexIndexMapping,&local_2c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_30);
  return;
}

Assistant:

void IVertexData::AddVertexMapping(uint32_t oldIndex, uint32_t newIndex)
{
    BoneAssignmentsForVertex(oldIndex, newIndex, boneAssignmentsMap[newIndex]);
    vertexIndexMapping[oldIndex].push_back(newIndex);
}